

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O0

idx_t duckdb::InitialNestedLoopJoin::Operation<unsigned_int,duckdb::NotEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  ulong in_RCX;
  ulong in_RDX;
  ulong *in_R8;
  ulong *in_R9;
  bool left_is_valid;
  idx_t left_position;
  bool right_is_valid;
  idx_t right_position;
  idx_t result_count;
  uint *rdata;
  uint *ldata;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  idx_t local_f0;
  UnifiedVectorFormat local_c8;
  SelectionVector *local_80;
  UnifiedVectorFormat *in_stack_ffffffffffffffb0;
  element_type *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffffc0._M_pi,(idx_t)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffffc0._M_pi,(idx_t)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  UnifiedVectorFormat::GetData<unsigned_int>((UnifiedVectorFormat *)&local_80);
  UnifiedVectorFormat::GetData<unsigned_int>(&local_c8);
  local_f0 = 0;
  while (*in_R9 < in_RCX) {
    SelectionVector::get_index(local_c8.sel,*in_R9);
    in_stack_fffffffffffffef6 =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   (in_stack_fffffffffffffef8,
                    CONCAT17(in_stack_fffffffffffffef7,
                             CONCAT16(in_stack_fffffffffffffef6,
                                      CONCAT15(in_stack_fffffffffffffef5,
                                               CONCAT14(in_stack_fffffffffffffef4,
                                                        in_stack_fffffffffffffef0)))));
    in_stack_ffffffffffffff04 = CONCAT13(in_stack_fffffffffffffef6,(int3)in_stack_ffffffffffffff04);
    while (*in_R8 < in_RDX) {
      if (local_f0 == 0x800) goto LAB_01abbc01;
      in_stack_fffffffffffffef8 =
           (TemplatedValidityMask<unsigned_long> *)SelectionVector::get_index(local_80,*in_R8);
      in_stack_fffffffffffffef5 =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     (in_stack_fffffffffffffef8,
                      CONCAT17(in_stack_fffffffffffffef7,
                               CONCAT16(in_stack_fffffffffffffef6,
                                        CONCAT15(in_stack_fffffffffffffef5,
                                                 CONCAT14(in_stack_fffffffffffffef4,
                                                          in_stack_fffffffffffffef0)))));
      in_stack_fffffffffffffef7 = in_stack_fffffffffffffef5;
      in_stack_fffffffffffffef4 =
           ComparisonOperationWrapper<duckdb::NotEquals>::Operation<unsigned_int>
                     ((uint *)in_stack_fffffffffffffef8,
                      (uint *)CONCAT17(in_stack_fffffffffffffef5,
                                       CONCAT16(in_stack_fffffffffffffef6,
                                                CONCAT15(in_stack_fffffffffffffef5,
                                                         CONCAT14(in_stack_fffffffffffffef4,
                                                                  in_stack_fffffffffffffef0)))),
                      (bool)in_stack_fffffffffffffeef,(bool)in_stack_fffffffffffffeee);
      if ((bool)in_stack_fffffffffffffef4) {
        SelectionVector::set_index
                  ((SelectionVector *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (idx_t)in_stack_fffffffffffffef8,
                   CONCAT17(in_stack_fffffffffffffef7,
                            CONCAT16(in_stack_fffffffffffffef6,
                                     CONCAT15(in_stack_fffffffffffffef5,
                                              CONCAT14(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0)))));
        SelectionVector::set_index
                  ((SelectionVector *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   (idx_t)in_stack_fffffffffffffef8,
                   CONCAT17(in_stack_fffffffffffffef7,
                            CONCAT16(in_stack_fffffffffffffef6,
                                     CONCAT15(in_stack_fffffffffffffef5,
                                              CONCAT14(in_stack_fffffffffffffef4,
                                                       in_stack_fffffffffffffef0)))));
        local_f0 = local_f0 + 1;
      }
      *in_R8 = *in_R8 + 1;
    }
    *in_R8 = 0;
    *in_R9 = *in_R9 + 1;
  }
LAB_01abbc01:
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,
                                        CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                )))));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,
                                        CONCAT14(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                )))));
  return local_f0;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		// initialize phase of nested loop join
		// fill lvector and rvector with matches from the base vectors
		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (; rpos < right_size; rpos++) {
			idx_t right_position = right_data.sel->get_index(rpos);
			bool right_is_valid = right_data.validity.RowIsValid(right_position);
			for (; lpos < left_size; lpos++) {
				if (result_count == STANDARD_VECTOR_SIZE) {
					// out of space!
					return result_count;
				}
				idx_t left_position = left_data.sel->get_index(lpos);
				bool left_is_valid = left_data.validity.RowIsValid(left_position);
				if (MATCH_OP::Operation(ldata[left_position], rdata[right_position], !left_is_valid, !right_is_valid)) {
					// emit tuple
					lvector.set_index(result_count, lpos);
					rvector.set_index(result_count, rpos);
					result_count++;
				}
			}
			lpos = 0;
		}
		return result_count;
	}